

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O2

void sqlcheck::CheckGenericPrimaryKey
               (Configuration *state,string *sql_statement,bool *print_statement)

{
  bool bVar1;
  allocator local_a9;
  string title;
  regex pattern;
  string local_68;
  string local_48;
  
  bVar1 = IsDDLStatement(sql_statement);
  if (bVar1) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&pattern,"(\\s+[\\(]?id\\s+)|(,id\\s+)|(\\s+id\\s+serial)",0x10);
    std::__cxx11::string::string((string *)&title,"Generic Primary Key",&local_a9);
    std::__cxx11::string::string((string *)&local_48,(string *)&title);
    std::__cxx11::string::string((string *)&local_68,anon_var_dwarf_a9516,&local_a9);
    CheckPattern(state,sql_statement,print_statement,&pattern,RISK_LEVEL_HIGH,
                 PATTERN_TYPE_LOGICAL_DATABASE_DESIGN,&local_48,&local_68,true,0);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&title);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&pattern);
  }
  return;
}

Assistant:

void CheckGenericPrimaryKey(Configuration& state,
                            const std::string& sql_statement,
                            bool& print_statement){

  auto ddl_statement = IsDDLStatement(sql_statement);
  if(ddl_statement == false){
    return;
  }

  std::regex pattern("(\\s+[\\(]?id\\s+)|(,id\\s+)|(\\s+id\\s+serial)");
  std::string title = "Generic Primary Key";
  PatternType pattern_type = PatternType::PATTERN_TYPE_LOGICAL_DATABASE_DESIGN;

  auto message =
      "● Skip using a generic primary key (id):  "
      "Adding an id column to every table causes several effects that make its "
      "use seem arbitrary. You might end up creating a redundant key or allow "
      "duplicate rows if you add this column in a compound key. "
      "The name id is so generic that it holds no meaning. This is especially "
      "important when you join two tables and they have the same primary "
      "key column name.";

  CheckPattern(state,
               sql_statement,
               print_statement,
               pattern,
               RISK_LEVEL_HIGH,
               pattern_type,
               title,
               message,
               true);

}